

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cpp
# Opt level: O0

int SearchCut(Situation *situation,int depth,int beta,bool allowNullMove)

{
  undefined8 uVar1;
  Movement move_00;
  Movement move_01;
  bool bVar2;
  int iVar3;
  int *piVar4;
  clock_t cVar5;
  undefined1 in_CL;
  int in_EDX;
  int in_ESI;
  Situation *in_RDI;
  int i;
  int move_num;
  Movement good_move;
  Movement move;
  Movement move_list [128];
  int best;
  int value;
  int in_stack_fffffffffffff948;
  int in_stack_fffffffffffff94c;
  undefined4 in_stack_fffffffffffff950;
  undefined4 in_stack_fffffffffffff954;
  int local_680;
  undefined4 in_stack_fffffffffffff988;
  undefined4 in_stack_fffffffffffff98c;
  undefined4 uVar6;
  undefined4 in_stack_fffffffffffff990;
  undefined4 uVar7;
  UINT32 UVar8;
  undefined4 uVar9;
  undefined4 in_stack_fffffffffffff9a4;
  int in_stack_fffffffffffff9bc;
  Movement *all_movements;
  undefined4 uVar10;
  UINT8 UVar11;
  UINT8 UVar12;
  undefined2 uVar13;
  UINT32 UVar14;
  undefined4 uVar15;
  undefined8 local_628;
  undefined4 auStack_620 [3];
  Movement in_stack_fffffffffffff9ec;
  int in_stack_fffffffffffffc70;
  int in_stack_fffffffffffffc74;
  Situation *in_stack_fffffffffffffc78;
  int iVar16;
  undefined3 in_stack_ffffffffffffffe4;
  uint depth_00;
  int local_4;
  
  depth_00 = CONCAT13(in_CL,in_stack_ffffffffffffffe4) & 0x1ffffff;
  all_movements = (Movement *)0;
  uVar10._0_1_ = '\0';
  uVar10._1_1_ = '\0';
  uVar10._2_2_ = 0;
  UVar11 = '\0';
  UVar12 = '\0';
  uVar13._0_1_ = '\0';
  uVar13._1_1_ = 0;
  UVar8 = 0;
  uVar6._0_1_ = '\0';
  uVar6._1_1_ = '\0';
  uVar6._2_2_ = 0;
  iVar16 = -0x100000;
  if (in_ESI < 1) {
    local_4 = QuiescentSearch(in_stack_fffffffffffffc78,in_stack_fffffffffffffc74,
                              in_stack_fffffffffffffc70);
  }
  else {
    local_4 = in_EDX;
    if ((step + -10000 < in_EDX) &&
       (local_4 = ReadHashTable(in_ESI,in_EDX + -1,in_EDX,(Movement *)&stack0xfffffffffffff9cc),
       local_4 == 0x100000)) {
      bVar2 = BanNullMove(in_RDI);
      if ((!bVar2) &&
         (((depth_00 & 0x1000000) != 0 &&
          (bVar2 = BeChecked((Situation *)
                             CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988)), !bVar2)
          ))) {
        MakeNullMove((Situation *)CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950));
        local_4 = SearchCut((Situation *)CONCAT44(in_ESI,in_EDX),depth_00,local_4,
                            SUB41((uint)iVar16 >> 0x18,0));
        local_4 = -local_4;
        UnMakeNullMove((Situation *)0x1133b1);
        if ((in_EDX <= local_4) &&
           (iVar3 = SearchCut((Situation *)CONCAT44(in_ESI,in_EDX),depth_00,local_4,
                              SUB41((uint)iVar16 >> 0x18,0)), in_EDX <= iVar3)) {
          piVar4 = std::max<int>((int *)&stack0xffffffffffffffec,&NULL_REDUCTION);
          SaveHashTable(*piVar4,in_EDX,'\x02',(Movement)ZEXT812(0));
          return in_EDX;
        }
      }
      if (((isTimeLimit & 1U) == 0) && (cVar5 = clock(), cVar5 - StartTime < 0x9c41)) {
        iVar3 = 0;
        uVar7 = CONCAT22(uVar13,CONCAT11(UVar12,UVar11));
        uVar9 = uVar6;
        MoveSort((Situation *)CONCAT44(uVar6,UVar8),
                 (int *)CONCAT26(uVar13,CONCAT15(UVar12,CONCAT14(UVar11,uVar10))),all_movements,
                 in_stack_fffffffffffff9ec,in_stack_fffffffffffff9bc);
        for (local_680 = 0; local_680 < iVar3; local_680 = local_680 + 1) {
          uVar1 = *(undefined8 *)((long)&local_628 + (long)local_680 * 0xc);
          UVar11 = (UINT8)uVar1;
          UVar12 = (UINT8)((ulong)uVar1 >> 8);
          uVar13 = (undefined2)((ulong)uVar1 >> 0x10);
          UVar14 = (UINT32)((ulong)uVar1 >> 0x20);
          uVar15 = auStack_620[(long)local_680 * 3];
          if ((UVar11 != '\0') || (UVar12 != '\0')) {
            bVar2 = MakeAMove((Situation *)CONCAT44(uVar9,UVar8),
                              (Movement *)CONCAT44(uVar7,in_stack_fffffffffffff990),SUB41(uVar6,3));
            if (bVar2) {
              local_4 = step + -10000;
            }
            else {
              local_4 = SearchCut((Situation *)CONCAT44(in_ESI,in_EDX),depth_00,local_4,
                                  SUB41((uint)iVar16 >> 0x18,0));
              local_4 = -local_4;
            }
            UnMakeAMove((Situation *)CONCAT44(in_stack_fffffffffffff9a4,iVar3));
            if ((iVar16 < local_4) &&
               (all_movements =
                     (Movement *)CONCAT44(UVar14,CONCAT22(uVar13,CONCAT11(UVar12,UVar11))),
               uVar10 = uVar15, iVar16 = local_4, in_EDX <= local_4)) {
              SetBestMove((Movement *)CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950),
                          in_stack_fffffffffffff94c,in_stack_fffffffffffff948);
              move_01.to = UVar12;
              move_01.from = UVar11;
              move_01.capture = (UINT8)uVar13;
              move_01._3_1_ = SUB21(uVar13,1);
              move_01.value = UVar14;
              move_01.catc = (UINT8)uVar15;
              move_01.movec = SUB41(uVar15,1);
              move_01._10_2_ = SUB42(uVar15,2);
              SaveHashTable(in_ESI,in_EDX,'\x02',move_01);
              return in_EDX;
            }
          }
        }
        move_00.catc = (UINT8)uVar10;
        move_00.movec = SUB41(uVar10,1);
        move_00._10_2_ = SUB42(uVar10,2);
        move_00._0_8_ = all_movements;
        SaveHashTable(in_ESI,in_EDX + -1,'\x01',move_00);
        local_4 = in_EDX + -1;
      }
      else {
        isTimeLimit = true;
        local_4 = 0x100000;
      }
    }
  }
  return local_4;
}

Assistant:

int SearchCut(Situation& situation, int depth, int beta, bool allowNullMove = false){
    int value;                      // 下一着法的分值
    int best;                       // 所有着法中的最佳分值
    Movement move_list[128];        // 当前所有着法
    Movement move;                  // 当前着法
    Movement good_move;             // 当前局面最佳着法
    move = good_move = NONE_MOVE;
    best = -NONE_VALUE;

    // 到达搜索深度
    if(depth <= 0){
        // 静态搜索评估
        return QuiescentSearch(situation, beta - 1, beta);
    }

    if(step - MAX_VALUE >= beta)
        return beta;

    // 置换表裁剪
    value = ReadHashTable(depth, beta - 1, beta, move);
    if(value != NONE_VALUE){
        return value;
    }

    // 空着裁剪(带检验)
    if(!BanNullMove(situation) && allowNullMove && !BeChecked(situation)){
        MakeNullMove(situation);
        value = -SearchCut(situation, depth - 1 - NULL_REDUCTION, 1 - beta);
        UnMakeNullMove(situation);

        if(value >= beta && SearchCut(situation, depth - NULL_REDUCTION, beta) >= beta){
            SaveHashTable(max(depth, NULL_REDUCTION), beta, hashBETA, NONE_MOVE);
            return beta;
        }
    }

    // 时间检测，避免超限
    if(isTimeLimit || clock() - StartTime > MAX_TIME){
        isTimeLimit = 1;
        return NONE_VALUE;
    }

    int move_num = 0;       // 着法数量
    // 生成着法
    MoveSort(situation, move_num, move_list, move, step);
    for(int i = 0; i < move_num; i++){
        move = move_list[i];
        if(move.from == 0 && move.to == 0) continue;
        // 下子
        if(MakeAMove(situation, move)){
            value = -MAX_VALUE + step;
        }
        else{
            value = -SearchCut(situation, depth - 1, 1 - beta, true);
        }
        // 回溯
        UnMakeAMove(situation);

        if(value > best){
            best = value;           // 更新最佳分数
            good_move = move;       // 更新最佳着法
            if(value >= beta){
                // 此着法是好着法，记录进历史表和杀手表
                SetBestMove(move, step, depth);
                SaveHashTable(depth, beta, hashBETA, move);
                return beta;
            }
        }
    }

    SaveHashTable(depth, beta - 1, hashALPHA, good_move);
    return beta - 1;
}